

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_10x10(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  JSAMPROW pJVar11;
  ulong uVar12;
  long lVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  DCTELEM *pDVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  int local_78 [8];
  int aiStack_58 [4];
  DCTELEM workspace [16];
  
  uVar12 = (ulong)start_col;
  lVar16 = 0;
  pDVar23 = data;
  do {
    pJVar11 = sample_data[lVar16];
    uVar18 = (ulong)((uint)pJVar11[uVar12] + (uint)pJVar11[uVar12 + 9]);
    uVar26 = (ulong)((uint)pJVar11[uVar12 + 1] + (uint)pJVar11[uVar12 + 8]);
    uVar29 = (ulong)((uint)pJVar11[uVar12 + 3] + (uint)pJVar11[uVar12 + 6]);
    uVar22 = (ulong)((uint)pJVar11[uVar12 + 4] + (uint)pJVar11[uVar12 + 5]);
    lVar15 = uVar22 + uVar18;
    lVar19 = uVar18 - uVar22;
    lVar28 = uVar29 + uVar26;
    lVar27 = uVar26 - uVar29;
    lVar17 = (ulong)pJVar11[uVar12] - (ulong)pJVar11[uVar12 + 9];
    lVar13 = (ulong)pJVar11[uVar12 + 1] - (ulong)pJVar11[uVar12 + 8];
    iVar20 = (uint)pJVar11[uVar12 + 2] + (uint)pJVar11[uVar12 + 7];
    lVar25 = (ulong)pJVar11[uVar12 + 2] - (ulong)pJVar11[uVar12 + 7];
    lVar21 = (ulong)pJVar11[uVar12 + 3] - (ulong)pJVar11[uVar12 + 6];
    lVar24 = (ulong)pJVar11[uVar12 + 4] - (ulong)pJVar11[uVar12 + 5];
    *pDVar23 = ((int)lVar15 + (int)lVar28 + iVar20) * 2 + -0xa00;
    pDVar23[4] = (int)(lVar28 * 0xffffffff204 + (ulong)(uint)(iVar20 * 2) * -0x1000000016a1 +
                       lVar15 * 0x249d + 0x800 >> 0xc);
    lVar15 = (lVar27 + lVar19) * 0x1a9a;
    pDVar23[2] = (int)(lVar19 * 0x1071 + lVar15 + 0x800U >> 0xc);
    pDVar23[6] = (int)(lVar15 + lVar27 * 0xfffffffba5c + 0x800U >> 0xc);
    pDVar23[5] = (((int)(lVar24 + lVar17) - (int)lVar25) - (int)(lVar13 - lVar21)) * 2;
    pDVar23[1] = (int)((ulong)(lVar24 * 0x714 + 0x800 +
                              lVar21 * 0x148c + lVar25 * 0x2000 + lVar13 * 0x2853 + lVar17 * 0x2cb3)
                      >> 0xc);
    lVar28 = (lVar13 - lVar21) * 0x19e3 + lVar25 * -0x2000 + (lVar24 + lVar17) * 0x9e3;
    lVar15 = (lVar21 + lVar13) * -0x12cf + (lVar17 - lVar24) * 0x1e6f + 0x800;
    pDVar23[3] = (int)((ulong)(lVar15 + lVar28) >> 0xc);
    pDVar23[7] = (int)((ulong)(lVar15 - lVar28) >> 0xc);
    piVar14 = local_78;
    if ((int)lVar16 != 7) {
      if ((int)lVar16 == 9) {
        lVar16 = 0;
        for (iVar20 = 7; -1 < iVar20; iVar20 = iVar20 + -1) {
          iVar1 = *(int *)((long)local_78 + lVar16);
          iVar2 = *(int *)((long)aiStack_58 + lVar16);
          iVar3 = *(int *)((long)data + lVar16);
          iVar4 = *(int *)((long)data + lVar16 + 0x20);
          lVar24 = (long)(iVar2 + iVar3);
          lVar21 = (long)(iVar1 + iVar4);
          iVar5 = *(int *)((long)data + lVar16 + 0x60);
          iVar6 = *(int *)((long)data + lVar16 + 0xc0);
          lVar13 = (long)(iVar6 + iVar5);
          iVar7 = *(int *)((long)data + lVar16 + 0x80);
          iVar8 = *(int *)((long)data + lVar16 + 0xa0);
          lVar28 = (long)(iVar8 + iVar7);
          lVar15 = lVar28 + lVar24;
          lVar24 = lVar24 - lVar28;
          lVar28 = lVar13 + lVar21;
          lVar21 = lVar21 - lVar13;
          iVar9 = *(int *)((long)data + lVar16 + 0x40);
          iVar10 = *(int *)((long)data + lVar16 + 0xe0);
          lVar19 = (long)(iVar10 + iVar9);
          *(int *)((long)data + lVar16) =
               (int)((lVar28 + lVar19 + lVar15) * 0x28f6 + 0x4000U >> 0xf);
          lVar25 = (long)(iVar3 - iVar2);
          lVar13 = (long)(iVar4 - iVar1);
          lVar17 = (long)(iVar9 - iVar10);
          lVar27 = (long)(iVar5 - iVar6);
          lVar30 = (long)(iVar7 - iVar8);
          *(int *)((long)data + lVar16 + 0x80) =
               (int)(lVar28 * 0x7fffffffee1a + lVar19 * -0x10000000039ee + lVar15 * 0x2edd + 0x4000U
                    >> 0xf);
          lVar15 = (lVar24 + lVar21) * 0x220c;
          *(int *)((long)data + lVar16 + 0x40) = (int)(lVar24 * 0x150b + lVar15 + 0x4000U >> 0xf);
          *(int *)((long)data + lVar16 + 0xc0) =
               (int)(lVar15 + lVar21 * 0x7fffffffa6dc + 0x4000U >> 0xf);
          *(int *)((long)data + lVar16 + 0xa0) =
               (int)((((lVar30 + lVar25) - (lVar13 - lVar27)) - lVar17) * 0x28f6 + 0x4000U >> 0xf);
          *(int *)((long)data + lVar16 + 0x20) =
               (int)((ulong)(lVar30 * 0x910 + 0x4000 +
                            lVar27 * 0x1a4c + lVar17 * 0x28f6 + lVar13 * 0x339d + lVar25 * 0x3937)
                    >> 0xf);
          lVar15 = (lVar13 - lVar27) * 0x2123 + lVar17 * -0x28f6 + (lVar30 + lVar25) * 0xca8;
          lVar28 = (lVar27 + lVar13) * -0x1813 + (lVar25 - lVar30) * 0x26f5 + 0x4000;
          *(int *)((long)data + lVar16 + 0x60) = (int)((ulong)(lVar28 + lVar15) >> 0xf);
          *(int *)((long)data + lVar16 + 0xe0) = (int)((ulong)(lVar28 - lVar15) >> 0xf);
          lVar16 = lVar16 + 4;
        }
        return;
      }
      piVar14 = pDVar23 + 8;
    }
    lVar16 = lVar16 + 1;
    pDVar23 = piVar14;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_fdct_10x10 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14;
  DCTELEM workspace[8*2];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* we scale the results further by 2 as part of output adaption */
  /* scaling for different DCT size. */
  /* cK represents sqrt(2) * cos(K*pi/20). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[9]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[8]);
    tmp12 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[7]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[6]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[5]);

    tmp10 = tmp0 + tmp4;
    tmp13 = tmp0 - tmp4;
    tmp11 = tmp1 + tmp3;
    tmp14 = tmp1 - tmp3;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[9]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[8]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[7]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[6]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[5]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 + tmp12 - 10 * CENTERJSAMPLE) << 1);
    tmp12 += tmp12;
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.144122806)) - /* c4 */
	      MULTIPLY(tmp11 - tmp12, FIX(0.437016024)),  /* c8 */
	      CONST_BITS-1);
    tmp10 = MULTIPLY(tmp13 + tmp14, FIX(0.831253876));    /* c6 */
    dataptr[2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp13, FIX(0.513743148)),  /* c2-c6 */
	      CONST_BITS-1);
    dataptr[6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(2.176250899)),  /* c2+c6 */
	      CONST_BITS-1);

    /* Odd part */

    tmp10 = tmp0 + tmp4;
    tmp11 = tmp1 - tmp3;
    dataptr[5] = (DCTELEM) ((tmp10 - tmp11 - tmp2) << 1);
    tmp2 <<= CONST_BITS;
    dataptr[1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0, FIX(1.396802247)) +          /* c1 */
	      MULTIPLY(tmp1, FIX(1.260073511)) + tmp2 +   /* c3 */
	      MULTIPLY(tmp3, FIX(0.642039522)) +          /* c7 */
	      MULTIPLY(tmp4, FIX(0.221231742)),           /* c9 */
	      CONST_BITS-1);
    tmp12 = MULTIPLY(tmp0 - tmp4, FIX(0.951056516)) -     /* (c3+c7)/2 */
	    MULTIPLY(tmp1 + tmp3, FIX(0.587785252));      /* (c1-c9)/2 */
    tmp13 = MULTIPLY(tmp10 + tmp11, FIX(0.309016994)) +   /* (c3-c7)/2 */
	    (tmp11 << (CONST_BITS - 1)) - tmp2;
    dataptr[3] = (DCTELEM) DESCALE(tmp12 + tmp13, CONST_BITS-1);
    dataptr[7] = (DCTELEM) DESCALE(tmp12 - tmp13, CONST_BITS-1);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 10)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * We must also scale the output by (8/10)**2 = 16/25, which we partially
   * fold into the constant multipliers and final/initial shifting:
   * cK now represents sqrt(2) * cos(K*pi/20) * 32/25.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*1];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*0];
    tmp12 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*7];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*6];
    tmp4 = dataptr[DCTSIZE*4] + dataptr[DCTSIZE*5];

    tmp10 = tmp0 + tmp4;
    tmp13 = tmp0 - tmp4;
    tmp11 = tmp1 + tmp3;
    tmp14 = tmp1 - tmp3;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*1];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*0];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*7];
    tmp3 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*6];
    tmp4 = dataptr[DCTSIZE*4] - dataptr[DCTSIZE*5];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11 + tmp12, FIX(1.28)), /* 32/25 */
	      CONST_BITS+2);
    tmp12 += tmp12;
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.464477191)) - /* c4 */
	      MULTIPLY(tmp11 - tmp12, FIX(0.559380511)),  /* c8 */
	      CONST_BITS+2);
    tmp10 = MULTIPLY(tmp13 + tmp14, FIX(1.064004961));    /* c6 */
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp13, FIX(0.657591230)),  /* c2-c6 */
	      CONST_BITS+2);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(2.785601151)),  /* c2+c6 */
	      CONST_BITS+2);

    /* Odd part */

    tmp10 = tmp0 + tmp4;
    tmp11 = tmp1 - tmp3;
    dataptr[DCTSIZE*5] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp11 - tmp2, FIX(1.28)),  /* 32/25 */
	      CONST_BITS+2);
    tmp2 = MULTIPLY(tmp2, FIX(1.28));                     /* 32/25 */
    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0, FIX(1.787906876)) +          /* c1 */
	      MULTIPLY(tmp1, FIX(1.612894094)) + tmp2 +   /* c3 */
	      MULTIPLY(tmp3, FIX(0.821810588)) +          /* c7 */
	      MULTIPLY(tmp4, FIX(0.283176630)),           /* c9 */
	      CONST_BITS+2);
    tmp12 = MULTIPLY(tmp0 - tmp4, FIX(1.217352341)) -     /* (c3+c7)/2 */
	    MULTIPLY(tmp1 + tmp3, FIX(0.752365123));      /* (c1-c9)/2 */
    tmp13 = MULTIPLY(tmp10 + tmp11, FIX(0.395541753)) +   /* (c3-c7)/2 */
	    MULTIPLY(tmp11, FIX(0.64)) - tmp2;            /* 16/25 */
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp12 + tmp13, CONST_BITS+2);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp12 - tmp13, CONST_BITS+2);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}